

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int __thiscall
icu_63::PluralRules::select
          (PluralRules *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  undefined4 in_register_00000034;
  FixedDecimal local_60;
  int local_1c;
  undefined8 uStack_18;
  int32_t number_local;
  PluralRules *this_local;
  
  uStack_18 = CONCAT44(in_register_00000034,__nfds);
  local_1c = (int)__readfds;
  this_local = this;
  FixedDecimal::FixedDecimal(&local_60,(double)local_1c);
  select(this,__nfds,(fd_set *)&local_60,__writefds,__exceptfds,__timeout);
  FixedDecimal::~FixedDecimal(&local_60);
  return (int)this;
}

Assistant:

UnicodeString
PluralRules::select(int32_t number) const {
    return select(FixedDecimal(number));
}